

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

Data * __thiscall Function::eval(Function *this,vector<Data_*,_std::allocator<Data_*>_> *parasData)

{
  _List_node_base *p_Var1;
  pointer ppDVar2;
  Runtime *this_00;
  Data *data;
  pointer ppDVar3;
  Function *pFVar4;
  _List_node_base *p_Var5;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  Data **i;
  
  this_00 = (Runtime *)operator_new(8);
  Runtime::Runtime(this_00);
  ppDVar3 = (parasData->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pFVar4 = this;
  while (pFVar4 = (Function *)
                  (pFVar4->paras).
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next, pFVar4 != this) {
    Runtime::assignVarToTop
              (this_00,(string *)
                       &(pFVar4->paras).
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl._M_node._M_size,*ppDVar3);
    ppDVar3 = ppDVar3 + 1;
  }
  p_Var5 = (_List_node_base *)&this->body;
  while( true ) {
    p_Var5 = (((_List_base<Atom_*,_std::allocator<Atom_*>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    p_Var1 = (this->body).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
             super__List_node_base._M_prev;
    data = (Data *)(*(code *)(p_Var5[1]._M_next)->_M_next[1]._M_prev)(p_Var5[1]._M_next,this_00);
    if (p_Var5 == p_Var1) break;
    Data::check(data);
  }
  ppDVar2 = (parasData->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppDVar3 = (parasData->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppDVar3 != ppDVar2; ppDVar3 = ppDVar3 + 1) {
    Data::check(*ppDVar3);
  }
  std::_Vector_base<Data_*,_std::allocator<Data_*>_>::~_Vector_base
            (&parasData->super__Vector_base<Data_*,_std::allocator<Data_*>_>);
  operator_delete(parasData);
  Runtime::~Runtime(this_00);
  operator_delete(this_00);
  return data;
}

Assistant:

Data *Function::eval(std::vector<Data *> *parasData) {
    Data *result;
    auto runtime = new Runtime();
    auto parasCursor = paras.begin();
    auto parasDataCursor = parasData->begin();
    while (parasCursor != paras.end()) {
        runtime->assignVarToTop(*parasCursor, *parasDataCursor);
        parasCursor++;
        parasDataCursor++;
    }
    auto bracketsCursor = body.begin();
    while (bracketsCursor != (--body.end())) {
        result = (*bracketsCursor)->eval(runtime);
        Data::check(result);
        bracketsCursor++;
    }
    result = (*bracketsCursor)->eval(runtime);
    for (auto &i: *parasData) {
        Data::check(i);
    }
    delete parasData;
    delete runtime;
    return result;
}